

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::handleError(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  Parser *in_RSI;
  bool bVar3;
  unique_ptr<InvalidCommand,_std::default_delete<InvalidCommand>_> local_20 [2];
  Parser *this_local;
  
  this_local = this;
  do {
    bVar1 = atEnd(in_RSI);
    bVar3 = false;
    if (!bVar1) {
      pTVar2 = nextToken(in_RSI);
      bVar3 = pTVar2->type != Separator;
    }
  } while (bVar3);
  clearError(in_RSI);
  std::make_unique<InvalidCommand>();
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<InvalidCommand,std::default_delete<InvalidCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,local_20);
  std::unique_ptr<InvalidCommand,_std::default_delete<InvalidCommand>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::handleError()
{
	// skip the rest of the statement
	while (!atEnd() && nextToken().type != TokenType::Separator);

	clearError();
	return std::make_unique<InvalidCommand>();
}